

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DwaCompressor::DwaCompressor
          (DwaCompressor *this,Header *hdr,int maxScanLineSize,int numScanLines,
          AcCompression acCompression)

{
  bool bVar1;
  Box2i *pBVar2;
  float *pfVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  Header *in_RSI;
  Compressor *in_RDI;
  undefined4 in_R8D;
  int i;
  ChannelList *in_stack_ffffffffffffff68;
  ChannelList *in_stack_ffffffffffffff70;
  int local_30;
  
  Compressor::Compressor(in_RDI,in_RSI);
  in_RDI->_vptr_Compressor = (_func_int **)&PTR__DwaCompressor_0374b7b8;
  *(undefined4 *)&in_RDI[1]._vptr_Compressor = in_R8D;
  *(undefined4 *)((long)&in_RDI[1]._vptr_Compressor + 4) = in_EDX;
  *(undefined4 *)&in_RDI[1]._header = in_ECX;
  Header::channels((Header *)0xa62828);
  ChannelList::ChannelList(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::
  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
  ::vector((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            *)0xa62853);
  std::
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  ::vector((vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
            *)0xa62866);
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  vector((vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
          *)0xa6287c);
  in_RDI[10]._header = (Header *)0x0;
  in_RDI[0xb]._vptr_Compressor = (_func_int **)0x0;
  in_RDI[0xb]._header = (Header *)0x0;
  in_RDI[0xc]._vptr_Compressor = (_func_int **)0x0;
  in_RDI[0xc]._header = (Header *)0x0;
  in_RDI[0xd]._vptr_Compressor = (_func_int **)0x0;
  in_RDI[0xd]._header = (Header *)0x0;
  in_RDI[0xe]._vptr_Compressor = (_func_int **)0x0;
  in_RDI[0x11]._header = (Header *)0x0;
  *(undefined4 *)&in_RDI[0x12]._vptr_Compressor = 0x42340000;
  pBVar2 = Header::dataWindow((Header *)0xa628fb);
  *(int *)((long)&in_RDI[1]._header + 4) = (pBVar2->min).x;
  pBVar2 = Header::dataWindow((Header *)0xa6291e);
  *(int *)&in_RDI[2]._vptr_Compressor = (pBVar2->min).y;
  pBVar2 = Header::dataWindow((Header *)0xa62942);
  *(int *)((long)&in_RDI[2]._vptr_Compressor + 4) = (pBVar2->max).x;
  pBVar2 = Header::dataWindow((Header *)0xa62966);
  *(int *)&in_RDI[2]._header = (pBVar2->max).y;
  for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
    (&in_RDI[0xe]._header)[local_30] = (Header *)0x0;
    (&in_RDI[0x10]._vptr_Compressor)[local_30] = (_func_int **)0x0;
  }
  bVar1 = hasDwaCompressionLevel((Header *)0xa62a18);
  if (bVar1) {
    pfVar3 = dwaCompressionLevel((Header *)0xa62a35);
    *(float *)&in_RDI[0x12]._vptr_Compressor = *pfVar3;
  }
  return;
}

Assistant:

DwaCompressor::DwaCompressor
    (const Header &hdr,
     int maxScanLineSize,
     int numScanLines,
     AcCompression acCompression)
:
    Compressor(hdr),
    _acCompression(acCompression),
    _maxScanLineSize(maxScanLineSize),
    _numScanLines(numScanLines),
    _channels(hdr.channels()),
    _packedAcBuffer(0),
    _packedAcBufferSize(0),
    _packedDcBuffer(0),
    _packedDcBufferSize(0),
    _rleBuffer(0),
    _rleBufferSize(0),
    _outBuffer(0),
    _outBufferSize(0),
    _zip(0),
    _dwaCompressionLevel(45.0)
{
    _min[0] = hdr.dataWindow().min.x;
    _min[1] = hdr.dataWindow().min.y;
    _max[0] = hdr.dataWindow().max.x;
    _max[1] = hdr.dataWindow().max.y;

    for (int i=0; i < NUM_COMPRESSOR_SCHEMES; ++i) 
    {
        _planarUncBuffer[i] = 0;
        _planarUncBufferSize[i] = 0;
    }
    
    //
    // Check the header for a quality attribute
    //

    if (hasDwaCompressionLevel (hdr))
        _dwaCompressionLevel = dwaCompressionLevel (hdr);
}